

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::php::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  pointer ppFVar1;
  Options *pOVar2;
  _anonymous_namespace_ *p_Var3;
  bool bVar4;
  int iVar5;
  LogMessage *pLVar6;
  undefined4 extraout_var;
  FileDescriptor *pFVar8;
  Options *pOVar9;
  pointer ppFVar10;
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *file;
  FileDescriptor *extraout_RDX_01;
  int i_3;
  ulong uVar11;
  pointer str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  int i_1;
  ulong uVar12;
  long lVar13;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  pointer ppFVar15;
  long lVar16;
  StringPiece full;
  StringPiece full_00;
  StringPiece full_01;
  allocator local_389;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_388;
  Options *local_380;
  string serialized;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  option_pair;
  string c_name;
  string metadata_classname;
  string metadata_c_name;
  string metadata_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  StringPiece local_278;
  StringPiece local_268;
  StringPiece local_258;
  StringPiece local_248;
  StringPiece local_238;
  FileDescriptorProto file_proto;
  string dep_c_name;
  Options options;
  string local_f0;
  Printer printer;
  ZeroCopyOutputStream *pZVar7;
  
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header;
  options.is_descriptor = false;
  options.aggregate_metadata = false;
  options.gen_c_wkt = false;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_388 = files;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_238,parameter);
  full.length_ = (size_type)",";
  full.ptr_ = (char *)local_238.length_;
  Split_abi_cxx11_(&local_290,(protobuf *)local_238.ptr_,full,(char *)0x1,SUB81(in_R9,0));
  for (str = local_290.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      str != local_290.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_248,str);
    full_00.length_ = (size_type)"=";
    full_00.ptr_ = (char *)local_248.length_;
    Split_abi_cxx11_(&option_pair,(protobuf *)local_248.ptr_,full_00,(char *)0x1,SUB81(in_R9,0));
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_258,
               option_pair.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    stringpiece_internal::StringPiece::StringPiece(&local_268,"aggregate_metadata");
    bVar4 = HasPrefixString(local_258,local_268);
    if (bVar4) {
      options.aggregate_metadata = true;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_278,
                 option_pair.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      full_01.length_ = (size_type)"#";
      full_01.ptr_ = (char *)local_278.length_;
      Split_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&printer,(protobuf *)local_278.ptr_,full_01,(char *)0x0,SUB81(in_R9,0));
      pZVar7 = printer.output_;
      for (pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     printer._0_8_;
          pbVar14 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pZVar7;
          pbVar14 = pbVar14 + 1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&options.aggregate_metadata_prefixes,pbVar14);
        internal::LogMessage::LogMessage
                  ((LogMessage *)&file_proto,LOGLEVEL_INFO,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                   ,0x8fe);
        pLVar6 = internal::LogMessage::operator<<((LogMessage *)&file_proto,pbVar14);
        internal::LogFinisher::operator=((LogFinisher *)&c_name,pLVar6);
        internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&printer);
    }
    else {
      bVar4 = std::operator==(option_pair.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"internal");
      if (bVar4) {
        options.is_descriptor = true;
      }
      else {
        bVar4 = std::operator==(option_pair.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"internal_generate_c_wkt")
        ;
        if (bVar4) {
          std::__cxx11::string::string
                    ((string *)&file_proto,"../ext/google/protobuf/wkt.inc",(allocator *)&printer);
          iVar5 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&file_proto);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
          std::__cxx11::string::~string((string *)&file_proto);
          io::Printer::Printer(&printer,pZVar7,'$');
          io::Printer::Print<>
                    (&printer,
                     "// This file is generated from the .proto files for the well-known\n// types. Do not edit!\n\n"
                    );
          io::Printer::Print<>
                    (&printer,
                     "ZEND_BEGIN_ARG_INFO_EX(arginfo_lookup, 0, 0, 1)\n  ZEND_ARG_INFO(0, key)\nZEND_END_ARG_INFO()\n\n"
                    );
          ppFVar1 = (local_388->
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pFVar8 = extraout_RDX;
          for (ppFVar15 = (local_388->
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppFVar15 != ppFVar1;
              ppFVar15 = ppFVar15 + 1) {
            (anonymous_namespace)::FilenameCName_abi_cxx11_
                      ((string *)&file_proto,(_anonymous_namespace_ *)*ppFVar15,pFVar8);
            io::Printer::Print<char[7],std::__cxx11::string>
                      (&printer,"static void $c_name$_AddDescriptor();\n",(char (*) [7])0x3dcf9c,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &file_proto);
            std::__cxx11::string::~string((string *)&file_proto);
            pFVar8 = extraout_RDX_00;
          }
          pOVar2 = (Options *)
                   (local_388->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pOVar9 = (Options *)
                   (local_388->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          while (pOVar9 != pOVar2) {
            p_Var3 = *(_anonymous_namespace_ **)pOVar9;
            local_380 = pOVar9;
            (anonymous_namespace)::FilenameCName_abi_cxx11_(&c_name,p_Var3,pFVar8);
            file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
            file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
            file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
            file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
            file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
            file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
            file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ =
                 (Rep *)file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_;
            (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                      (&metadata_filename,p_Var3,(FileDescriptor *)&file_proto,pOVar9);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
            anon_unknown_2::FilenameToClassname(&metadata_classname,&metadata_filename);
            std::__cxx11::string::string((string *)&file_proto,"\\",(allocator *)&dep_c_name);
            std::__cxx11::string::string((string *)&serialized,"_",(allocator *)&local_f0);
            StringReplace(&metadata_c_name,&metadata_classname,(string *)&file_proto,&serialized,
                          true);
            std::__cxx11::string::~string((string *)&serialized);
            std::__cxx11::string::~string((string *)&file_proto);
            std::__cxx11::string::string((string *)&serialized,"\\",(allocator *)&local_f0);
            std::__cxx11::string::string((string *)&dep_c_name,"\\\\",&local_389);
            StringReplace((string *)&file_proto,&metadata_classname,&serialized,&dep_c_name,true);
            std::__cxx11::string::operator=((string *)&metadata_classname,(string *)&file_proto);
            std::__cxx11::string::~string((string *)&file_proto);
            std::__cxx11::string::~string((string *)&dep_c_name);
            std::__cxx11::string::~string((string *)&serialized);
            FileDescriptorProto::FileDescriptorProto(&file_proto);
            FileDescriptor::CopyTo((FileDescriptor *)p_Var3,&file_proto);
            serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
            serialized._M_string_length = 0;
            serialized.field_2._M_local_buf[0] = '\0';
            MessageLite::SerializeToString((MessageLite *)&file_proto,&serialized);
            pbVar14 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)p_Var3;
            std::__cxx11::to_string(&dep_c_name,serialized._M_string_length);
            io::Printer::
            Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[5],std::__cxx11::string>
                      (&printer,
                       "/* $filename$ */\n\nzend_class_entry* $metadata_c_name$_ce;\n\nconst char $c_name$_descriptor [$size$] = {\n"
                       ,(char (*) [9])"filename",pbVar14,(char (*) [7])0x3dcf9c,&c_name,
                       (char (*) [16])"metadata_c_name",&metadata_c_name,(char (*) [5])0x3cb329,
                       &dep_c_name);
            std::__cxx11::string::~string((string *)&dep_c_name);
            uVar11 = 0;
            while (uVar11 < serialized._M_string_length) {
              for (uVar12 = 0; (uVar12 < 0x19 && (uVar12 + uVar11 < serialized._M_string_length));
                  uVar12 = uVar12 + 1) {
                std::__cxx11::string::substr((ulong)&local_f0,(ulong)&serialized);
                CEscape(&dep_c_name,&local_f0);
                io::Printer::Print<char[3],std::__cxx11::string>
                          (&printer,"\'$ch$\', ",(char (*) [3])0x431696,&dep_c_name);
                std::__cxx11::string::~string((string *)&dep_c_name);
                std::__cxx11::string::~string((string *)&local_f0);
              }
              io::Printer::Print<>(&printer,"\n");
              uVar11 = uVar12 + uVar11;
            }
            io::Printer::
            Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string>
                      (&printer,
                       "};\n\nstatic void $c_name$_AddDescriptor() {\n  if (DescriptorPool_HasFile(\"$filename$\")) return;\n"
                       ,(char (*) [9])"filename",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)p_Var3
                       ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [16])"metadata_c_name",
                       &metadata_c_name);
            for (iVar5 = 0; iVar5 < *(int *)(p_Var3 + 0x20); iVar5 = iVar5 + 1) {
              pFVar8 = FileDescriptor::dependency((FileDescriptor *)p_Var3,iVar5);
              (anonymous_namespace)::FilenameCName_abi_cxx11_
                        (&dep_c_name,(_anonymous_namespace_ *)pFVar8,file);
              io::Printer::Print<char[11],std::__cxx11::string>
                        (&printer,"  $dep_c_name$_AddDescriptor();\n",(char (*) [11])"dep_c_name",
                         &dep_c_name);
              std::__cxx11::string::~string((string *)&dep_c_name);
            }
            in_R9 = &c_name;
            io::Printer::
            Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[19],std::__cxx11::string>
                      (&printer,
                       "  DescriptorPool_AddDescriptor(\"$filename$\", $c_name$_descriptor,\n                               sizeof($c_name$_descriptor));\n}\n\nstatic PHP_METHOD($metadata_c_name$, initOnce) {\n  $c_name$_AddDescriptor();\n}\n\nstatic zend_function_entry $metadata_c_name$_methods[] = {\n  PHP_ME($metadata_c_name$, initOnce, arginfo_void, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $metadata_c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$metadata_classname$\",\n                   $metadata_c_name$_methods);\n\n  $metadata_c_name$_ce = zend_register_internal_class(&tmp_ce);\n}\n\n"
                       ,(char (*) [9])"filename",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)p_Var3
                       ,(char (*) [7])0x3dcf9c,in_R9,(char (*) [16])"metadata_c_name",
                       &metadata_c_name,(char (*) [19])"metadata_classname",&metadata_classname);
            lVar16 = 0;
            for (lVar13 = 0; lVar13 < *(int *)(p_Var3 + 0x2c); lVar13 = lVar13 + 1) {
              anon_unknown_2::GenerateCMessage
                        ((Descriptor *)(*(long *)(p_Var3 + 0x58) + lVar16),&printer);
              lVar16 = lVar16 + 0x88;
            }
            lVar16 = 0;
            for (lVar13 = 0; lVar13 < *(int *)(p_Var3 + 0x30); lVar13 = lVar13 + 1) {
              anon_unknown_2::GenerateCEnum
                        ((EnumDescriptor *)(*(long *)(p_Var3 + 0x60) + lVar16),&printer);
              lVar16 = lVar16 + 0x48;
            }
            std::__cxx11::string::~string((string *)&serialized);
            FileDescriptorProto::~FileDescriptorProto(&file_proto);
            std::__cxx11::string::~string((string *)&metadata_c_name);
            std::__cxx11::string::~string((string *)&metadata_classname);
            std::__cxx11::string::~string((string *)&metadata_filename);
            std::__cxx11::string::~string((string *)&c_name);
            pFVar8 = extraout_RDX_01;
            pOVar9 = (Options *)&local_380->aggregate_metadata_prefixes;
          }
          io::Printer::Print<>(&printer,"static void WellKnownTypes_ModuleInit() {\n");
          local_380 = (Options *)
                      (local_388->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          for (pOVar9 = (Options *)
                        (local_388->
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; pOVar9 != local_380;
              pOVar9 = (Options *)&pOVar9->aggregate_metadata_prefixes) {
            p_Var3 = *(_anonymous_namespace_ **)pOVar9;
            file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
            file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
            file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
            file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
            file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
            file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
            file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ =
                 (Rep *)file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_;
            (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                      (&c_name,p_Var3,(FileDescriptor *)&file_proto,pOVar9);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
            anon_unknown_2::FilenameToClassname((string *)&file_proto,&c_name);
            std::__cxx11::string::string
                      ((string *)&metadata_classname,"\\",(allocator *)&serialized);
            std::__cxx11::string::string((string *)&metadata_c_name,"_",(allocator *)&dep_c_name);
            StringReplace(&metadata_filename,(string *)&file_proto,&metadata_classname,
                          &metadata_c_name,true);
            std::__cxx11::string::~string((string *)&metadata_c_name);
            std::__cxx11::string::~string((string *)&metadata_classname);
            io::Printer::Print<char[16],std::__cxx11::string>
                      (&printer,"  $metadata_c_name$_ModuleInit();\n",
                       (char (*) [16])"metadata_c_name",&metadata_filename);
            lVar16 = 0;
            for (lVar13 = 0; lVar13 < *(int *)(p_Var3 + 0x2c); lVar13 = lVar13 + 1) {
              anon_unknown_2::GenerateCInit
                        ((Descriptor *)(*(long *)(p_Var3 + 0x58) + lVar16),&printer);
              lVar16 = lVar16 + 0x88;
            }
            lVar16 = 0;
            for (lVar13 = 0; lVar13 < *(int *)(p_Var3 + 0x30); lVar13 = lVar13 + 1) {
              anon_unknown_2::GenerateEnumCInit
                        ((EnumDescriptor *)(*(long *)(p_Var3 + 0x60) + lVar16),&printer);
              lVar16 = lVar16 + 0x48;
            }
            std::__cxx11::string::~string((string *)&metadata_filename);
            std::__cxx11::string::~string((string *)&file_proto);
            std::__cxx11::string::~string((string *)&c_name);
          }
          io::Printer::Print<>(&printer,"}\n");
          io::Printer::~Printer(&printer);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])();
          }
        }
        else {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&file_proto,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                     ,0x905);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&file_proto,"Unknown codegen option: ");
          pLVar6 = internal::LogMessage::operator<<
                             (pLVar6,option_pair.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          internal::LogFinisher::operator=((LogFinisher *)&printer,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&option_pair);
  }
  this_00 = &local_290;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  ppFVar15 = (local_388->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  ppFVar1 = (local_388->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    ppFVar10 = ppFVar1;
    if (ppFVar10 == ppFVar15) break;
    bVar4 = Generate((Generator *)this_00,*ppFVar10,&options,generator_context,error);
    ppFVar1 = ppFVar10 + 1;
  } while (bVar4);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&options.aggregate_metadata_prefixes._M_t);
  return ppFVar10 == ppFVar15;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  Options options;

  for (const auto& option : Split(parameter, ",", true)) {
    const std::vector<std::string> option_pair = Split(option, "=", true);
    if (HasPrefixString(option_pair[0], "aggregate_metadata")) {
      options.aggregate_metadata = true;
      for (const auto& prefix : Split(option_pair[1], "#", false)) {
        options.aggregate_metadata_prefixes.emplace(prefix);
        GOOGLE_LOG(INFO) << prefix;
      }
    } else if (option_pair[0] == "internal") {
      options.is_descriptor = true;
    } else if (option_pair[0] == "internal_generate_c_wkt") {
      GenerateCWellKnownTypes(files, generator_context);
    } else {
      GOOGLE_LOG(FATAL) << "Unknown codegen option: " << option_pair[0];
    }
  }

  for (auto file : files) {
    if (!Generate(file, options, generator_context, error)) {
      return false;
    }
  }

  return true;
}